

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

MPP_RET h264e_vepu_mbrc_init(HalH264eVepuMbRcCtx *ctx,HalH264eVepuMbRc *mbrc)

{
  void *pvVar1;
  MPP_RET MVar2;
  
  pvVar1 = mpp_osal_calloc("h264e_vepu_mbrc_init",0x58);
  MVar2 = MPP_OK;
  if (pvVar1 == (void *)0x0) {
    _mpp_log_l(2,"hal_h264e_vepu_v2","failed to alloc rate control context\n","h264e_vepu_mbrc_init"
              );
    MVar2 = MPP_ERR_NOMEM;
  }
  memset(&mbrc->cp_distance_mbs,0,0xb8);
  mbrc->qp_init = -1;
  mbrc->qp_min = 0x10;
  mbrc->qp_max = 0x30;
  *ctx = pvVar1;
  return MVar2;
}

Assistant:

MPP_RET h264e_vepu_mbrc_init(HalH264eVepuMbRcCtx *ctx, HalH264eVepuMbRc *mbrc)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepuMbRcImpl *p = mpp_calloc(HalH264eVepuMbRcImpl, 1);
    if (!p) {
        mpp_err_f("failed to alloc rate control context\n");
        ret = MPP_ERR_NOMEM;
    }

    memset(mbrc, 0, sizeof(*mbrc));
    mbrc->qp_init   = -1;
    mbrc->qp_max    = 48;
    mbrc->qp_min    = 16;

    *ctx = p;
    return ret;
}